

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O0

int is_pure(boolean talk)

{
  aligntyp alignment;
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  int local_5c;
  long local_58;
  int local_48;
  long local_40;
  long local_30;
  aligntyp original_alignment;
  int purity;
  boolean talk_local;
  
  alignment = u.ualignbase[1];
  if ((flags.debug != '\0') && (talk != '\0')) {
    if (u.ualign.type == u.ualignbase[1]) {
      if (u.ualignbase[0] == u.ualignbase[1]) {
        if ((ulong)moves / 200 + 10 < 0x15) {
          local_30 = (ulong)moves / 200 + 10;
        }
        else {
          local_30 = 0x14;
        }
        if (u.ualign.record < local_30) {
          if ((ulong)moves / 200 + 10 < 0x15) {
            local_40 = (ulong)moves / 200 + 10;
          }
          else {
            local_40 = 0x14;
          }
          pline("You are currently %d and require %d.",(ulong)(uint)u.ualign.record,local_40);
          cVar1 = yn_function("adjust?","yn",'y');
          if (cVar1 == 'y') {
            if ((ulong)moves / 200 + 10 < 0x15) {
              local_48 = moves / 200 + 10;
            }
            else {
              local_48 = 0x14;
            }
            u.ualign.record = local_48;
          }
        }
      }
      else {
        pline("You have converted.");
      }
    }
    else {
      pcVar2 = align_str(u.ualign.type);
      pcVar3 = align_str(alignment);
      pline("You are currently %s instead of %s.",pcVar2,pcVar3);
    }
  }
  if ((ulong)moves / 200 + 10 < 0x15) {
    local_58 = (ulong)moves / 200 + 10;
  }
  else {
    local_58 = 0x14;
  }
  if (((u.ualign.record < local_58) || (u.ualign.type != alignment)) ||
     (u.ualignbase[0] != alignment)) {
    local_5c = 0;
    if (u.ualignbase[0] != alignment) {
      local_5c = -1;
    }
  }
  else {
    local_5c = 1;
  }
  return local_5c;
}

Assistant:

static int is_pure(boolean talk)
{
    int purity;
    aligntyp original_alignment = u.ualignbase[A_ORIGINAL];

    if (wizard && talk) {
	if (u.ualign.type != original_alignment) {
	    pline("You are currently %s instead of %s.",
		align_str(u.ualign.type), align_str(original_alignment));
	} else if (u.ualignbase[A_CURRENT] != original_alignment) {
	    pline("You have converted.");
	} else if (u.ualign.record < MIN_QUEST_ALIGN) {
	    pline("You are currently %d and require %d.",
		u.ualign.record, MIN_QUEST_ALIGN);
	    if (yn_function("adjust?", ynchars, 'y') == 'y')
		u.ualign.record = MIN_QUEST_ALIGN;
	}
    }
    
    purity = (u.ualign.record >= MIN_QUEST_ALIGN &&
	      u.ualign.type == original_alignment &&
	      u.ualignbase[A_CURRENT] == original_alignment) ?  1 :
	     (u.ualignbase[A_CURRENT] != original_alignment) ? -1 : 0;
    return purity;
}